

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::init
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  deUint64 *pdVar1;
  int *piVar2;
  pointer __src;
  int iVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  ulong uVar5;
  pointer __dest;
  NotSupportedError *this_00;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pSVar12;
  long lVar13;
  size_t __n;
  int local_f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar4 = Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if (0x7f < pRVar4->m_width) {
    pRVar4 = Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    if (0x7f < pRVar4->m_height) {
      lVar13 = 0;
      (**(code **)(lVar9 + 0x1a00))(0,0,0x80,0x80);
      (**(code **)(lVar9 + 0x120))(0x302,0x303);
      (**(code **)(lVar9 + 0x100))(0x8006);
      (**(code **)(lVar9 + 0x5e0))(0xbe2);
      pSVar12 = (this->m_results).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pSVar12 ==
            (this->m_results).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __src = (this->m_results).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)pSVar12 - (long)__src;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar9 = (long)__n >> 3;
          uVar10 = lVar9 * -0x71c71c71c71c71c7;
          uVar5 = 1;
          if (pSVar12 != __src) {
            uVar5 = uVar10;
          }
          uVar7 = uVar5 + uVar10;
          if (0x1c71c71c71c71c6 < uVar7) {
            uVar7 = 0x1c71c71c71c71c7;
          }
          uVar11 = 0x1c71c71c71c71c7;
          if (!CARRY8(uVar5,uVar10)) {
            uVar11 = uVar7;
          }
          if (uVar11 == 0) {
            __dest = (pointer)0x0;
          }
          else {
            __dest = (pointer)operator_new(uVar11 * 0x48);
          }
          pdVar1 = &(__dest->result).duration.renderReadDuration + lVar9;
          *pdVar1 = 0;
          pdVar1[1] = 0;
          pdVar1 = &(__dest->result).duration.renderDuration + lVar9;
          *pdVar1 = 0;
          pdVar1[1] = 0;
          piVar2 = &(__dest->result).uploadedDataSize + lVar9 * 2;
          *(undefined8 *)piVar2 = 0;
          *(undefined8 *)(piVar2 + 2) = 0;
          piVar2 = &(__dest->scene).gridWidth + lVar9 * 2;
          *(undefined8 *)piVar2 = 0;
          *(undefined8 *)(piVar2 + 2) = 0;
          (&(__dest->result).duration.fitResponseDuration)[lVar9] = 0;
          if (0 < (long)__n) {
            memmove(__dest,__src,__n);
          }
          if (__src != (pointer)0x0) {
            operator_delete(__src,(long)(this->m_results).
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__src);
          }
          pSVar12 = (pointer)((long)__dest + __n + 0x48);
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_start = __dest;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar11;
        }
        else {
          (pSVar12->result).duration.renderReadDuration = 0;
          (pSVar12->result).duration.totalDuration = 0;
          (pSVar12->result).duration.renderDuration = 0;
          (pSVar12->result).duration.readDuration = 0;
          (pSVar12->result).uploadedDataSize = 0;
          (pSVar12->result).renderDataSize = 0;
          (pSVar12->result).unrelatedDataSize = 0;
          (pSVar12->result).numVertices = 0;
          (pSVar12->scene).gridWidth = 0;
          (pSVar12->scene).gridHeight = 0;
          *(undefined8 *)&(pSVar12->scene).gridLayers = 0;
          (pSVar12->result).duration.fitResponseDuration = 0;
          pSVar12 = (this->m_results).
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
        }
        iVar3 = *(int *)((long)&DAT_01c204d0 + lVar13);
        pSVar12[-1].scene.gridHeight = iVar3;
        pSVar12[-1].scene.gridWidth = iVar3;
        pSVar12[-1].scene.gridLayers = 5;
        pSVar12[-1].result.numVertices = iVar3 * iVar3 * 0x1e;
        pSVar12[-1].result.uploadedDataSize = -1;
        pSVar12[-1].result.renderDataSize = -1;
        pSVar12[-1].result.unrelatedDataSize = -1;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x4c);
      std::vector<int,_std::allocator<int>_>::resize
                (&this->m_iterationOrder,
                 ((long)pSVar12 -
                  (long)(this->m_results).
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      generateTwoPassRandomIterationOrder
                (&this->m_iterationOrder,
                 (int)((ulong)((long)(this->m_iterationOrder).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->m_iterationOrder).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      return extraout_EAX;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f8[1] = 0x80;
  de::toString<int>(&local_d0,local_f8 + 1);
  std::operator+(&local_70,"Test case requires ",&local_d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_f8[0] = 0x80;
  de::toString<int>(&local_90,local_f8);
  std::operator+(&local_50,&local_f0,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar6[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_00,&local_b0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// generate iterations

	{
		const int gridSizes[] = { 20, 26, 32, 38, 44, 50, 56, 62, 68, 74, 80,  86,  92,  98,  104, 110, 116, 122, 128 };

		for (int gridNdx = 0; gridNdx < DE_LENGTH_OF_ARRAY(gridSizes); ++gridNdx)
		{
			m_results.push_back(SampleResult());

			m_results.back().scene.gridHeight = gridSizes[gridNdx];
			m_results.back().scene.gridWidth = gridSizes[gridNdx];
			m_results.back().scene.gridLayers = 5;

			m_results.back().result.numVertices = getLayeredGridNumVertices(m_results.back().scene);

			// test cases set these, initialize to dummy values
			m_results.back().result.renderDataSize = -1;
			m_results.back().result.uploadedDataSize = -1;
			m_results.back().result.unrelatedDataSize = -1;
		}
	}

	// randomize iteration order
	{
		m_iterationOrder.resize(m_results.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_iterationOrder.size());
	}
}